

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyLoader.cpp
# Opt level: O1

void __thiscall
Assimp::PLYImporter::LoadVertex
          (PLYImporter *this,Element *pcElement,ElementInstance *instElement,uint pos)

{
  uint uVar1;
  pointer pPVar2;
  pointer pPVar3;
  double dVar4;
  PLYImporter *pPVar5;
  pointer pPVar6;
  ulong uVar7;
  aiMesh *paVar8;
  aiVector3D *paVar9;
  aiColor4D *paVar10;
  runtime_error *prVar11;
  EDataType EVar12;
  int iVar13;
  int iVar14;
  EDataType EVar15;
  EDataType eType;
  ulong uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  bool bVar22;
  char cVar23;
  bool bVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  EDataType local_b4;
  EDataType local_b0;
  EDataType local_ac;
  float local_a8;
  EDataType local_a4;
  float local_a0;
  float local_9c;
  undefined1 *local_98 [2];
  undefined1 local_88 [20];
  float local_74;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  int local_60;
  EDataType local_5c;
  EDataType local_58;
  EDataType local_54;
  EDataType local_50;
  int local_4c;
  PLYImporter *local_48;
  float local_40;
  uint local_3c;
  Element *local_38;
  
  if (pcElement == (Element *)0x0) {
    __assert_fail("nullptr != pcElement",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Ply/PlyLoader.cpp"
                  ,0x115,
                  "void Assimp::PLYImporter::LoadVertex(const PLY::Element *, const PLY::ElementInstance *, unsigned int)"
                 );
  }
  if (instElement == (ElementInstance *)0x0) {
    __assert_fail("nullptr != instElement",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Ply/PlyLoader.cpp"
                  ,0x116,
                  "void Assimp::PLYImporter::LoadVertex(const PLY::Element *, const PLY::ElementInstance *, unsigned int)"
                 );
  }
  pPVar6 = (pcElement->alProperties).
           super__Vector_base<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>._M_impl
           .super__Vector_impl_data._M_start;
  pPVar2 = (pcElement->alProperties).
           super__Vector_base<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (pPVar6 == pPVar2) {
    bVar22 = true;
    eType = EDT_Char;
    local_74 = -NAN;
    local_70 = -NAN;
    local_a0 = -NAN;
    iVar21 = -1;
    local_54 = EDT_Char;
    local_50 = EDT_Char;
    local_58 = EDT_Char;
    local_4c = -1;
    local_60 = -1;
    local_a4 = EDT_Char;
    local_5c = EDT_Char;
    EVar12 = EDT_Char;
    fVar27 = 0.0;
    local_ac = EDT_Char;
    local_a8 = -NAN;
    local_6c = -NAN;
    iVar14 = -1;
    local_b4 = EDT_Char;
    local_b0 = EDT_Char;
    EVar15 = EDT_Char;
    iVar20 = -1;
    iVar17 = -1;
    iVar19 = -1;
  }
  else {
    EVar15 = EDT_Char;
    iVar19 = -1;
    iVar17 = -1;
    iVar20 = -1;
    local_b0 = EDT_Char;
    local_b4 = EDT_Char;
    iVar14 = -1;
    local_6c = -NAN;
    local_a8 = -NAN;
    local_ac = EDT_Char;
    local_9c = 0.0;
    EVar12 = EDT_Char;
    iVar13 = 0;
    iVar18 = 0;
    local_5c = EDT_Char;
    local_a4 = EDT_Char;
    local_60 = -1;
    local_4c = -1;
    local_58 = EDT_Char;
    local_50 = EDT_Char;
    local_54 = EDT_Char;
    eType = EDT_Char;
    iVar21 = -1;
    local_a0 = -NAN;
    local_70 = -NAN;
    local_74 = -NAN;
    do {
      if (pPVar6->bIsList == false) {
        switch(pPVar6->Semantic) {
        case EST_XCoord:
          iVar13 = iVar13 + 1;
          EVar15 = pPVar6->eType;
          iVar20 = iVar18;
          break;
        case EST_YCoord:
          iVar13 = iVar13 + 1;
          local_b0 = pPVar6->eType;
          iVar17 = iVar18;
          break;
        case EST_ZCoord:
          iVar13 = iVar13 + 1;
          local_b4 = pPVar6->eType;
          iVar19 = iVar18;
          break;
        case EST_XNormal:
          iVar13 = iVar13 + 1;
          local_ac = pPVar6->eType;
          local_a8 = (float)iVar18;
          break;
        case EST_YNormal:
          iVar13 = iVar13 + 1;
          local_9c = (float)pPVar6->eType;
          local_6c = (float)iVar18;
          break;
        case EST_ZNormal:
          iVar13 = iVar13 + 1;
          EVar12 = pPVar6->eType;
          iVar14 = iVar18;
          break;
        case EST_UTextureCoord:
          iVar13 = iVar13 + 1;
          local_a4 = pPVar6->eType;
          local_60 = iVar18;
          break;
        case EST_VTextureCoord:
          iVar13 = iVar13 + 1;
          local_5c = pPVar6->eType;
          local_4c = iVar18;
          break;
        case EST_Red:
          iVar13 = iVar13 + 1;
          eType = pPVar6->eType;
          iVar21 = iVar18;
          break;
        case EST_Green:
          iVar13 = iVar13 + 1;
          local_54 = pPVar6->eType;
          local_a0 = (float)iVar18;
          break;
        case EST_Blue:
          iVar13 = iVar13 + 1;
          local_50 = pPVar6->eType;
          local_70 = (float)iVar18;
          break;
        case EST_Alpha:
          iVar13 = iVar13 + 1;
          local_58 = pPVar6->eType;
          local_74 = (float)iVar18;
        }
      }
      pPVar6 = pPVar6 + 1;
      iVar18 = iVar18 + 1;
    } while (pPVar6 != pPVar2);
    bVar22 = iVar13 == 0;
    fVar27 = local_9c;
  }
  if (bVar22) {
    return;
  }
  local_9c = 0.0;
  fVar25 = 0.0;
  local_48 = this;
  local_3c = pos;
  local_38 = pcElement;
  if (iVar20 != -1) {
    uVar7 = (ulong)iVar20;
    pPVar3 = (instElement->alProperties).
             super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar16 = ((long)(instElement->alProperties).
                    super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar3 >> 3) *
             -0x5555555555555555;
    if (uVar16 < uVar7 || uVar16 - uVar7 == 0) {
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_98[0] = local_88;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_98,"Invalid .ply file: Property index is out of range.","");
      std::runtime_error::runtime_error(prVar11,(string *)local_98);
      *(undefined ***)prVar11 = &PTR__runtime_error_007fa260;
      __cxa_throw(prVar11,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    if (EVar15 < EDT_INVALID) {
      dVar4 = **(double **)
                &pPVar3[uVar7].avList.
                 super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
      ;
      fVar25 = SUB84(dVar4,0);
      switch(EVar15) {
      default:
        fVar25 = (float)(int)fVar25;
        break;
      case EDT_UChar:
      case EDT_UShort:
      case EDT_UInt:
        fVar25 = (float)((ulong)dVar4 & 0xffffffff);
        break;
      case EDT_Float:
        break;
      case EDT_Double:
        fVar25 = (float)dVar4;
      }
    }
  }
  if (iVar17 != -1) {
    uVar7 = (ulong)iVar17;
    pPVar3 = (instElement->alProperties).
             super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar16 = ((long)(instElement->alProperties).
                    super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar3 >> 3) *
             -0x5555555555555555;
    if (uVar16 < uVar7 || uVar16 - uVar7 == 0) {
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_98[0] = local_88;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_98,"Invalid .ply file: Property index is out of range.","");
      std::runtime_error::runtime_error(prVar11,(string *)local_98);
      *(undefined ***)prVar11 = &PTR__runtime_error_007fa260;
      __cxa_throw(prVar11,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    if (local_b0 < EDT_INVALID) {
      dVar4 = **(double **)
                &pPVar3[uVar7].avList.
                 super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
      ;
      local_9c = SUB84(dVar4,0);
      switch(local_b0) {
      default:
        local_9c = (float)(int)local_9c;
        break;
      case EDT_UChar:
      case EDT_UShort:
      case EDT_UInt:
        local_9c = (float)((ulong)dVar4 & 0xffffffff);
        break;
      case EDT_Float:
        break;
      case EDT_Double:
        local_9c = (float)dVar4;
      }
    }
  }
  local_64 = 0.0;
  fVar26 = 0.0;
  if (iVar19 != -1) {
    uVar7 = (ulong)iVar19;
    pPVar3 = (instElement->alProperties).
             super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar16 = ((long)(instElement->alProperties).
                    super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar3 >> 3) *
             -0x5555555555555555;
    if (uVar16 < uVar7 || uVar16 - uVar7 == 0) {
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_98[0] = local_88;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_98,"Invalid .ply file: Property index is out of range.","");
      std::runtime_error::runtime_error(prVar11,(string *)local_98);
      *(undefined ***)prVar11 = &PTR__runtime_error_007fa260;
      __cxa_throw(prVar11,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    if (local_b4 < EDT_INVALID) {
      dVar4 = **(double **)
                &pPVar3[uVar7].avList.
                 super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
      ;
      fVar26 = SUB84(dVar4,0);
      switch(local_b4) {
      default:
        fVar26 = (float)(int)fVar26;
        break;
      case EDT_UChar:
      case EDT_UShort:
      case EDT_UInt:
        fVar26 = (float)((ulong)dVar4 & 0xffffffff);
        break;
      case EDT_Float:
        break;
      case EDT_Double:
        fVar26 = (float)dVar4;
      }
    }
  }
  bVar22 = local_a8 != -NAN;
  if (bVar22) {
    uVar7 = (ulong)(int)local_a8;
    pPVar3 = (instElement->alProperties).
             super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar16 = ((long)(instElement->alProperties).
                    super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar3 >> 3) *
             -0x5555555555555555;
    if (uVar16 < uVar7 || uVar16 - uVar7 == 0) {
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_98[0] = local_88;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_98,"Invalid .ply file: Property index is out of range.","");
      std::runtime_error::runtime_error(prVar11,(string *)local_98);
      *(undefined ***)prVar11 = &PTR__runtime_error_007fa260;
      __cxa_throw(prVar11,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    if (local_ac < EDT_INVALID) {
      dVar4 = **(double **)
                &pPVar3[uVar7].avList.
                 super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
      ;
      local_64 = SUB84(dVar4,0);
      switch(local_ac) {
      default:
        local_64 = (float)(int)local_64;
        break;
      case EDT_UChar:
      case EDT_UShort:
      case EDT_UInt:
        local_64 = (float)((ulong)dVar4 & 0xffffffff);
        break;
      case EDT_Float:
        break;
      case EDT_Double:
        local_64 = (float)dVar4;
      }
    }
  }
  local_68 = 0.0;
  local_a8 = 0.0;
  if (local_6c != -NAN) {
    uVar7 = (ulong)(int)local_6c;
    pPVar3 = (instElement->alProperties).
             super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar16 = ((long)(instElement->alProperties).
                    super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar3 >> 3) *
             -0x5555555555555555;
    if (uVar16 < uVar7 || uVar16 - uVar7 == 0) {
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_98[0] = local_88;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_98,"Invalid .ply file: Property index is out of range.","");
      std::runtime_error::runtime_error(prVar11,(string *)local_98);
      *(undefined ***)prVar11 = &PTR__runtime_error_007fa260;
      __cxa_throw(prVar11,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar22 = true;
    local_a8 = 0.0;
    if ((uint)fVar27 < EDT_INVALID) {
      dVar4 = **(double **)
                &pPVar3[uVar7].avList.
                 super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
      ;
      switch(fVar27) {
      default:
        local_a8 = (float)(int)SUB84(dVar4,0);
        break;
      case 1.4013e-45:
      case 4.2039e-45:
      case 7.00649e-45:
        local_a8 = (float)((ulong)dVar4 & 0xffffffff);
        break;
      case 8.40779e-45:
        local_a8 = SUB84(dVar4,0);
        break;
      case 9.80909e-45:
        local_a8 = (float)dVar4;
      }
    }
  }
  if (iVar14 != -1) {
    uVar7 = (ulong)iVar14;
    pPVar3 = (instElement->alProperties).
             super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar16 = ((long)(instElement->alProperties).
                    super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar3 >> 3) *
             -0x5555555555555555;
    if (uVar16 < uVar7 || uVar16 - uVar7 == 0) {
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_98[0] = local_88;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_98,"Invalid .ply file: Property index is out of range.","");
      std::runtime_error::runtime_error(prVar11,(string *)local_98);
      *(undefined ***)prVar11 = &PTR__runtime_error_007fa260;
      __cxa_throw(prVar11,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    if (EVar12 < EDT_INVALID) {
      dVar4 = **(double **)
                &pPVar3[uVar7].avList.
                 super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
      ;
      local_68 = SUB84(dVar4,0);
      switch(EVar12) {
      default:
        local_68 = (float)(int)local_68;
        break;
      case EDT_UChar:
      case EDT_UShort:
      case EDT_UInt:
        local_68 = (float)((ulong)dVar4 & 0xffffffff);
        break;
      case EDT_Float:
        bVar22 = true;
        goto LAB_004a479e;
      case EDT_Double:
        local_68 = (float)dVar4;
      }
      bVar22 = true;
    }
    else {
      bVar22 = true;
    }
  }
LAB_004a479e:
  local_40 = 0.0;
  local_6c = 0.0;
  cVar23 = iVar21 != -1;
  if ((bool)cVar23) {
    uVar7 = (ulong)iVar21;
    pPVar3 = (instElement->alProperties).
             super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar16 = ((long)(instElement->alProperties).
                    super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar3 >> 3) *
             -0x5555555555555555;
    if (uVar16 < uVar7 || uVar16 - uVar7 == 0) {
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_98[0] = local_88;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_98,"Invalid .ply file: Property index is out of range.","");
      std::runtime_error::runtime_error(prVar11,(string *)local_98);
      *(undefined ***)prVar11 = &PTR__runtime_error_007fa260;
      __cxa_throw(prVar11,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    local_6c = NormalizeColorValue(**(ValueUnion **)
                                     &pPVar3[uVar7].avList.
                                      super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                                   ,eType);
  }
  if (local_a0 != -NAN) {
    uVar7 = (ulong)(int)local_a0;
    pPVar3 = (instElement->alProperties).
             super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar16 = ((long)(instElement->alProperties).
                    super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar3 >> 3) *
             -0x5555555555555555;
    if (uVar16 < uVar7 || uVar16 - uVar7 == 0) {
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_98[0] = local_88;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_98,"Invalid .ply file: Property index is out of range.","");
      std::runtime_error::runtime_error(prVar11,(string *)local_98);
      *(undefined ***)prVar11 = &PTR__runtime_error_007fa260;
      __cxa_throw(prVar11,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    local_40 = NormalizeColorValue(**(ValueUnion **)
                                     &pPVar3[uVar7].avList.
                                      super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                                   ,local_54);
    cVar23 = true;
  }
  if (local_70 == -NAN) {
    local_70 = 0.0;
  }
  else {
    uVar7 = (ulong)(int)local_70;
    pPVar3 = (instElement->alProperties).
             super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar16 = ((long)(instElement->alProperties).
                    super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar3 >> 3) *
             -0x5555555555555555;
    if (uVar16 < uVar7 || uVar16 - uVar7 == 0) {
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_98[0] = local_88;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_98,"Invalid .ply file: Property index is out of range.","");
      std::runtime_error::runtime_error(prVar11,(string *)local_98);
      *(undefined ***)prVar11 = &PTR__runtime_error_007fa260;
      __cxa_throw(prVar11,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    local_70 = NormalizeColorValue(**(ValueUnion **)
                                     &pPVar3[uVar7].avList.
                                      super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                                   ,local_50);
    cVar23 = true;
  }
  if (local_74 == -NAN) {
    local_74 = 1.0;
  }
  else {
    uVar7 = (ulong)(int)local_74;
    pPVar3 = (instElement->alProperties).
             super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar16 = ((long)(instElement->alProperties).
                    super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar3 >> 3) *
             -0x5555555555555555;
    if (uVar16 < uVar7 || uVar16 - uVar7 == 0) {
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_98[0] = local_88;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_98,"Invalid .ply file: Property index is out of range.","");
      std::runtime_error::runtime_error(prVar11,(string *)local_98);
      *(undefined ***)prVar11 = &PTR__runtime_error_007fa260;
      __cxa_throw(prVar11,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    local_74 = NormalizeColorValue(**(ValueUnion **)
                                     &pPVar3[uVar7].avList.
                                      super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                                   ,local_58);
    cVar23 = true;
  }
  local_a0 = 0.0;
  fVar27 = 0.0;
  bVar24 = local_60 != -1;
  if (bVar24) {
    uVar7 = (ulong)local_60;
    pPVar3 = (instElement->alProperties).
             super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar16 = ((long)(instElement->alProperties).
                    super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar3 >> 3) *
             -0x5555555555555555;
    if (uVar16 < uVar7 || uVar16 - uVar7 == 0) {
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_98[0] = local_88;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_98,"Invalid .ply file: Property index is out of range.","");
      std::runtime_error::runtime_error(prVar11,(string *)local_98);
      *(undefined ***)prVar11 = &PTR__runtime_error_007fa260;
      __cxa_throw(prVar11,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    if (local_a4 < EDT_INVALID) {
      dVar4 = **(double **)
                &pPVar3[uVar7].avList.
                 super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
      ;
      fVar27 = SUB84(dVar4,0);
      switch(local_a4) {
      default:
        fVar27 = (float)(int)fVar27;
        break;
      case EDT_UChar:
      case EDT_UShort:
      case EDT_UInt:
        fVar27 = (float)((ulong)dVar4 & 0xffffffff);
        break;
      case EDT_Float:
        break;
      case EDT_Double:
        fVar27 = (float)dVar4;
      }
    }
  }
  if (local_4c != -1) {
    uVar7 = (ulong)local_4c;
    pPVar3 = (instElement->alProperties).
             super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar16 = ((long)(instElement->alProperties).
                    super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar3 >> 3) *
             -0x5555555555555555;
    if (uVar16 < uVar7 || uVar16 - uVar7 == 0) {
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_98[0] = local_88;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_98,"Invalid .ply file: Property index is out of range.","");
      std::runtime_error::runtime_error(prVar11,(string *)local_98);
      *(undefined ***)prVar11 = &PTR__runtime_error_007fa260;
      __cxa_throw(prVar11,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar24 = true;
    if (local_5c < EDT_INVALID) {
      dVar4 = **(double **)
                &pPVar3[uVar7].avList.
                 super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
      ;
      local_a0 = SUB84(dVar4,0);
      switch(local_5c) {
      default:
        local_a0 = (float)(int)local_a0;
        break;
      case EDT_UChar:
      case EDT_UShort:
      case EDT_UInt:
        local_a0 = (float)((ulong)dVar4 & 0xffffffff);
        break;
      case EDT_Float:
        break;
      case EDT_Double:
        local_a0 = (float)dVar4;
      }
    }
  }
  if (this->mGeneratedMesh == (aiMesh *)0x0) {
    paVar8 = (aiMesh *)operator_new(0x520);
    paVar8->mPrimitiveTypes = 0;
    paVar8->mNumVertices = 0;
    paVar8->mNumFaces = 0;
    memset(&paVar8->mVertices,0,0xcc);
    paVar8->mBones = (aiBone **)0x0;
    paVar8->mMaterialIndex = 0;
    (paVar8->mName).length = 0;
    (paVar8->mName).data[0] = '\0';
    memset((paVar8->mName).data + 1,0x1b,0x3ff);
    paVar8->mNumAnimMeshes = 0;
    paVar8->mAnimMeshes = (aiAnimMesh **)0x0;
    paVar8->mMethod = 0;
    (paVar8->mAABB).mMin.x = 0.0;
    (paVar8->mAABB).mMin.y = 0.0;
    (paVar8->mAABB).mMin.z = 0.0;
    (paVar8->mAABB).mMax.x = 0.0;
    (paVar8->mAABB).mMax.y = 0.0;
    (paVar8->mAABB).mMax.z = 0.0;
    paVar8->mTextureCoords[0] = (aiVector3D *)0x0;
    paVar8->mTextureCoords[1] = (aiVector3D *)0x0;
    paVar8->mTextureCoords[2] = (aiVector3D *)0x0;
    paVar8->mTextureCoords[3] = (aiVector3D *)0x0;
    paVar8->mTextureCoords[4] = (aiVector3D *)0x0;
    paVar8->mTextureCoords[5] = (aiVector3D *)0x0;
    paVar8->mTextureCoords[6] = (aiVector3D *)0x0;
    paVar8->mTextureCoords[7] = (aiVector3D *)0x0;
    paVar8->mNumUVComponents[0] = 0;
    paVar8->mNumUVComponents[1] = 0;
    paVar8->mNumUVComponents[2] = 0;
    paVar8->mNumUVComponents[3] = 0;
    paVar8->mNumUVComponents[4] = 0;
    paVar8->mNumUVComponents[5] = 0;
    paVar8->mNumUVComponents[6] = 0;
    paVar8->mNumUVComponents[7] = 0;
    paVar8->mColors[0] = (aiColor4D *)0x0;
    paVar8->mColors[1] = (aiColor4D *)0x0;
    paVar8->mColors[2] = (aiColor4D *)0x0;
    paVar8->mColors[3] = (aiColor4D *)0x0;
    paVar8->mColors[4] = (aiColor4D *)0x0;
    paVar8->mColors[5] = (aiColor4D *)0x0;
    paVar8->mColors[6] = (aiColor4D *)0x0;
    paVar8->mColors[7] = (aiColor4D *)0x0;
    this->mGeneratedMesh = paVar8;
    paVar8->mMaterialIndex = 0;
  }
  if (this->mGeneratedMesh->mVertices == (aiVector3D *)0x0) {
    local_60 = CONCAT31(local_60._1_3_,cVar23);
    this->mGeneratedMesh->mNumVertices = local_38->NumOccur;
    paVar8 = this->mGeneratedMesh;
    uVar1 = paVar8->mNumVertices;
    paVar9 = (aiVector3D *)operator_new__((ulong)uVar1 * 0xc);
    if (uVar1 != 0) {
      memset(paVar9,0,(((ulong)uVar1 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
    }
    paVar8->mVertices = paVar9;
    cVar23 = (char)local_60;
  }
  paVar9 = this->mGeneratedMesh->mVertices;
  uVar7 = (ulong)local_3c;
  paVar9[uVar7].x = fVar25;
  paVar9[uVar7].y = local_9c;
  paVar9[uVar7].z = fVar26;
  if (bVar22) {
    paVar8 = this->mGeneratedMesh;
    if (paVar8->mNormals == (aiVector3D *)0x0) {
      uVar1 = paVar8->mNumVertices;
      paVar9 = (aiVector3D *)operator_new__((ulong)uVar1 * 0xc);
      if (uVar1 != 0) {
        memset(paVar9,0,(((ulong)uVar1 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
      }
      paVar8->mNormals = paVar9;
      this = local_48;
    }
    paVar9 = this->mGeneratedMesh->mNormals;
    paVar9[uVar7].x = local_64;
    paVar9[uVar7].y = local_a8;
    paVar9[uVar7].z = local_68;
  }
  if (cVar23 != '\0') {
    paVar8 = this->mGeneratedMesh;
    if (paVar8->mColors[0] == (aiColor4D *)0x0) {
      uVar1 = paVar8->mNumVertices;
      uVar16 = (ulong)uVar1 << 4;
      paVar10 = (aiColor4D *)operator_new__(uVar16);
      if ((ulong)uVar1 != 0) {
        memset(paVar10,0,uVar16);
      }
      paVar8->mColors[0] = paVar10;
      this = local_48;
    }
    paVar10 = this->mGeneratedMesh->mColors[0];
    paVar10[uVar7].r = local_6c;
    paVar10[uVar7].g = local_40;
    paVar10[uVar7].b = local_70;
    paVar10[uVar7].a = local_74;
  }
  pPVar5 = local_48;
  if (bVar24) {
    if (local_48->mGeneratedMesh->mTextureCoords[0] == (aiVector3D *)0x0) {
      local_48->mGeneratedMesh->mNumUVComponents[0] = 2;
      paVar8 = local_48->mGeneratedMesh;
      uVar1 = paVar8->mNumVertices;
      paVar9 = (aiVector3D *)operator_new__((ulong)uVar1 * 0xc);
      if (uVar1 != 0) {
        memset(paVar9,0,(((ulong)uVar1 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
      }
      paVar8->mTextureCoords[0] = paVar9;
    }
    paVar9 = pPVar5->mGeneratedMesh->mTextureCoords[0];
    paVar9[uVar7].x = fVar27;
    paVar9[uVar7].y = local_a0;
    paVar9[uVar7].z = 0.0;
  }
  return;
}

Assistant:

void PLYImporter::LoadVertex(const PLY::Element* pcElement, const PLY::ElementInstance* instElement, unsigned int pos) {
    ai_assert(nullptr != pcElement);
    ai_assert(nullptr != instElement);

    ai_uint aiPositions[3] = { 0xFFFFFFFF, 0xFFFFFFFF, 0xFFFFFFFF };
    PLY::EDataType aiTypes[3] = { EDT_Char, EDT_Char, EDT_Char };

    ai_uint aiNormal[3] = { 0xFFFFFFFF, 0xFFFFFFFF, 0xFFFFFFFF };
    PLY::EDataType aiNormalTypes[3] = { EDT_Char, EDT_Char, EDT_Char };

    unsigned int aiColors[4] = { 0xFFFFFFFF, 0xFFFFFFFF, 0xFFFFFFFF, 0xFFFFFFFF };
    PLY::EDataType aiColorsTypes[4] = { EDT_Char, EDT_Char, EDT_Char, EDT_Char };

    unsigned int aiTexcoord[2] = { 0xFFFFFFFF, 0xFFFFFFFF };
    PLY::EDataType aiTexcoordTypes[2] = { EDT_Char, EDT_Char };

    // now check whether which normal components are available
    unsigned int _a( 0 ), cnt( 0 );
    for ( std::vector<PLY::Property>::const_iterator a = pcElement->alProperties.begin();
            a != pcElement->alProperties.end(); ++a, ++_a) {
        if ((*a).bIsList) {
            continue;
        }

        // Positions
        if (PLY::EST_XCoord == (*a).Semantic) {
            ++cnt;
            aiPositions[0] = _a;
            aiTypes[0] = (*a).eType;
        } else if (PLY::EST_YCoord == (*a).Semantic) {
            ++cnt;
            aiPositions[1] = _a;
            aiTypes[1] = (*a).eType;
        } else if (PLY::EST_ZCoord == (*a).Semantic) {
            ++cnt;
            aiPositions[2] = _a;
            aiTypes[2] = (*a).eType;
        } else if (PLY::EST_XNormal == (*a).Semantic) {
            // Normals
            ++cnt;
            aiNormal[0] = _a;
            aiNormalTypes[0] = (*a).eType;
        } else if (PLY::EST_YNormal == (*a).Semantic) {
            ++cnt;
            aiNormal[1] = _a;
            aiNormalTypes[1] = (*a).eType;
        } else if (PLY::EST_ZNormal == (*a).Semantic) {
            ++cnt;
            aiNormal[2] = _a;
            aiNormalTypes[2] = (*a).eType;
        } else if (PLY::EST_Red == (*a).Semantic) {
            // Colors
            ++cnt;
            aiColors[0] = _a;
            aiColorsTypes[0] = (*a).eType;
        } else if (PLY::EST_Green == (*a).Semantic) {
            ++cnt;
            aiColors[1] = _a;
            aiColorsTypes[1] = (*a).eType;
        } else if (PLY::EST_Blue == (*a).Semantic) {
            ++cnt;
            aiColors[2] = _a;
            aiColorsTypes[2] = (*a).eType;
        } else if (PLY::EST_Alpha == (*a).Semantic) {
            ++cnt;
            aiColors[3] = _a;
            aiColorsTypes[3] = (*a).eType;
        } else if (PLY::EST_UTextureCoord == (*a).Semantic) {
            // Texture coordinates
            ++cnt;
            aiTexcoord[0] = _a;
            aiTexcoordTypes[0] = (*a).eType;
        } else if (PLY::EST_VTextureCoord == (*a).Semantic) {
            ++cnt;
            aiTexcoord[1] = _a;
            aiTexcoordTypes[1] = (*a).eType;
        }
    }

    // check whether we have a valid source for the vertex data
    if (0 != cnt) {
        // Position
        aiVector3D vOut;
        if (0xFFFFFFFF != aiPositions[0]) {
            vOut.x = PLY::PropertyInstance::ConvertTo<ai_real>(
                GetProperty(instElement->alProperties, aiPositions[0]).avList.front(), aiTypes[0]);
        }

        if (0xFFFFFFFF != aiPositions[1]) {
            vOut.y = PLY::PropertyInstance::ConvertTo<ai_real>(
                GetProperty(instElement->alProperties, aiPositions[1]).avList.front(), aiTypes[1]);
        }

        if (0xFFFFFFFF != aiPositions[2]) {
            vOut.z = PLY::PropertyInstance::ConvertTo<ai_real>(
                GetProperty(instElement->alProperties, aiPositions[2]).avList.front(), aiTypes[2]);
        }

        // Normals
        aiVector3D nOut;
        bool haveNormal = false;
        if (0xFFFFFFFF != aiNormal[0]) {
            nOut.x = PLY::PropertyInstance::ConvertTo<ai_real>(
                GetProperty(instElement->alProperties, aiNormal[0]).avList.front(), aiNormalTypes[0]);
            haveNormal = true;
        }

        if (0xFFFFFFFF != aiNormal[1]) {
            nOut.y = PLY::PropertyInstance::ConvertTo<ai_real>(
                GetProperty(instElement->alProperties, aiNormal[1]).avList.front(), aiNormalTypes[1]);
            haveNormal = true;
        }

        if (0xFFFFFFFF != aiNormal[2]) {
            nOut.z = PLY::PropertyInstance::ConvertTo<ai_real>(
                GetProperty(instElement->alProperties, aiNormal[2]).avList.front(), aiNormalTypes[2]);
            haveNormal = true;
        }

        //Colors
        aiColor4D cOut;
        bool haveColor = false;
        if (0xFFFFFFFF != aiColors[0]) {
            cOut.r = NormalizeColorValue(GetProperty(instElement->alProperties,
                aiColors[0]).avList.front(), aiColorsTypes[0]);
            haveColor = true;
        }

        if (0xFFFFFFFF != aiColors[1]) {
            cOut.g = NormalizeColorValue(GetProperty(instElement->alProperties,
                aiColors[1]).avList.front(), aiColorsTypes[1]);
            haveColor = true;
        }

        if (0xFFFFFFFF != aiColors[2]) {
            cOut.b = NormalizeColorValue(GetProperty(instElement->alProperties,
                aiColors[2]).avList.front(), aiColorsTypes[2]);
            haveColor = true;
        }

        // assume 1.0 for the alpha channel if it is not set
        if (0xFFFFFFFF == aiColors[3]) {
            cOut.a = 1.0;
        } else {
            cOut.a = NormalizeColorValue(GetProperty(instElement->alProperties,
                aiColors[3]).avList.front(), aiColorsTypes[3]);

            haveColor = true;
        }

        //Texture coordinates
        aiVector3D tOut;
        tOut.z = 0;
        bool haveTextureCoords = false;
        if (0xFFFFFFFF != aiTexcoord[0]) {
            tOut.x = PLY::PropertyInstance::ConvertTo<ai_real>(
                GetProperty(instElement->alProperties, aiTexcoord[0]).avList.front(), aiTexcoordTypes[0]);
            haveTextureCoords = true;
        }

        if (0xFFFFFFFF != aiTexcoord[1]) {
            tOut.y = PLY::PropertyInstance::ConvertTo<ai_real>(
                GetProperty(instElement->alProperties, aiTexcoord[1]).avList.front(), aiTexcoordTypes[1]);
            haveTextureCoords = true;
        }

        //create aiMesh if needed
        if ( nullptr == mGeneratedMesh ) {
            mGeneratedMesh = new aiMesh();
            mGeneratedMesh->mMaterialIndex = 0;
        }

        if (nullptr == mGeneratedMesh->mVertices) {
            mGeneratedMesh->mNumVertices = pcElement->NumOccur;
            mGeneratedMesh->mVertices = new aiVector3D[mGeneratedMesh->mNumVertices];
        }

        mGeneratedMesh->mVertices[pos] = vOut;

        if (haveNormal) {
            if (nullptr == mGeneratedMesh->mNormals)
                mGeneratedMesh->mNormals = new aiVector3D[mGeneratedMesh->mNumVertices];
            mGeneratedMesh->mNormals[pos] = nOut;
        }

        if (haveColor) {
            if (nullptr == mGeneratedMesh->mColors[0])
                mGeneratedMesh->mColors[0] = new aiColor4D[mGeneratedMesh->mNumVertices];
            mGeneratedMesh->mColors[0][pos] = cOut;
        }

        if (haveTextureCoords) {
            if (nullptr == mGeneratedMesh->mTextureCoords[0]) {
                mGeneratedMesh->mNumUVComponents[0] = 2;
                mGeneratedMesh->mTextureCoords[0] = new aiVector3D[mGeneratedMesh->mNumVertices];
            }
            mGeneratedMesh->mTextureCoords[0][pos] = tOut;
        }
    }
}